

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O2

void cmdline_run_saved(Conf *conf)

{
  size_t i;
  ulong uVar1;
  cmdline_saved_param_set *pcVar2;
  long lVar3;
  size_t pri;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    pcVar2 = saves + lVar4;
    lVar3 = 0;
    for (uVar1 = 0; uVar1 < saves[lVar4].nsaved; uVar1 = uVar1 + 1) {
      cmdline_process_param
                (*(char **)((long)&pcVar2->params->p + lVar3),
                 *(char **)((long)&pcVar2->params->value + lVar3),0,conf);
      safefree(*(void **)((long)&pcVar2->params->p + lVar3));
      safefree(*(void **)((long)&pcVar2->params->value + lVar3));
      lVar3 = lVar3 + 0x10;
    }
    saves[lVar4].nsaved = 0;
  }
  return;
}

Assistant:

void cmdline_run_saved(Conf *conf)
{
    for (size_t pri = 0; pri < NPRIORITIES; pri++) {
        for (size_t i = 0; i < saves[pri].nsaved; i++) {
            cmdline_process_param(saves[pri].params[i].p,
                                  saves[pri].params[i].value, 0, conf);
            sfree(saves[pri].params[i].p);
            sfree(saves[pri].params[i].value);
        }
        saves[pri].nsaved = 0;
    }
}